

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O3

RuleBuilder * __thiscall Potassco::RuleBuilder::clearHead(RuleBuilder *this)

{
  uint *puVar1;
  uint uVar2;
  
  puVar1 = (uint *)(this->mem_).beg_;
  uVar2 = 0x14;
  if (0x14 < puVar1[4]) {
    uVar2 = puVar1[4];
  }
  *puVar1 = uVar2 & 0x7fffffff;
  puVar1[1] = 0;
  puVar1[2] = 0;
  return this;
}

Assistant:

RuleBuilder& RuleBuilder::clearHead() {
	Rule* r = unfreeze(false);
	r->top = std::max(r->body.mend, static_cast<uint32_t>(sizeof(Rule)));
	r->head.init(0, 0);
	return *this;
}